

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

void __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking::Breaking
          (Breaking *this,Flow *breaking)

{
  Flow *breaking_local;
  Breaking *this_local;
  
  Flow::Flow(&this->super_Flow,breaking);
  return;
}

Assistant:

Breaking(Flow breaking) : Flow(breaking) {}